

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diagnostic.cpp
# Opt level: O3

void __thiscall spvtools::DiagnosticStream::~DiagnosticStream(DiagnosticStream *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  _Manager_type p_Var3;
  uint uVar4;
  ostream *poVar5;
  spv_message_level_t __args;
  long *local_48;
  long local_38 [2];
  
  if ((this->error_ != SPV_FAILED_MATCH) &&
     ((this->consumer_).super__Function_base._M_manager != (_Manager_type)0x0)) {
    uVar4 = this->error_ + (SPV_FAILED_MATCH|SPV_END_OF_STREAM);
    __args = SPV_MSG_ERROR;
    if (uVar4 < 0xc) {
      __args = *(spv_message_level_t *)(&DAT_0034293c + (ulong)uVar4 * 4);
    }
    if ((this->disassembled_instruction_)._M_string_length != 0) {
      std::ios::widen((char)*(undefined8 *)(*(long *)this + -0x18) + (char)this);
      std::ostream::put((char)this);
      poVar5 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  ",2);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,(this->disassembled_instruction_)._M_dataplus._M_p,
                          (this->disassembled_instruction_)._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
    }
    std::__cxx11::stringbuf::str();
    std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
    operator()(&this->consumer_,__args,"input",&this->position_,(char *)local_48);
    if (local_48 != local_38) {
      operator_delete(local_48,local_38[0] + 1);
    }
  }
  pcVar2 = (this->disassembled_instruction_)._M_dataplus._M_p;
  paVar1 = &(this->disassembled_instruction_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  p_Var3 = (this->consumer_).super__Function_base._M_manager;
  if (p_Var3 != (_Manager_type)0x0) {
    (*p_Var3)((_Any_data *)&this->consumer_,(_Any_data *)&this->consumer_,__destroy_functor);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this);
  std::ios_base::~ios_base((ios_base *)&this->field_0x70);
  return;
}

Assistant:

DiagnosticStream::~DiagnosticStream() {
  if (error_ != SPV_FAILED_MATCH && consumer_ != nullptr) {
    auto level = SPV_MSG_ERROR;
    switch (error_) {
      case SPV_SUCCESS:
      case SPV_REQUESTED_TERMINATION:  // Essentially success.
        level = SPV_MSG_INFO;
        break;
      case SPV_WARNING:
        level = SPV_MSG_WARNING;
        break;
      case SPV_UNSUPPORTED:
      case SPV_ERROR_INTERNAL:
      case SPV_ERROR_INVALID_TABLE:
        level = SPV_MSG_INTERNAL_ERROR;
        break;
      case SPV_ERROR_OUT_OF_MEMORY:
        level = SPV_MSG_FATAL;
        break;
      default:
        break;
    }
    if (disassembled_instruction_.size() > 0)
      stream_ << std::endl << "  " << disassembled_instruction_ << std::endl;

    consumer_(level, "input", position_, stream_.str().c_str());
  }
}